

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void print_all_timers(bw_timers_t *timers,int32 n_frame)

{
  double local_70;
  double local_58;
  double local_40;
  double local_28;
  int32 n_frame_local;
  bw_timers_t *timers_local;
  
  if ((double)(timers->utt_timer).t_cpu <= 0.0) {
    local_28 = 0.0;
  }
  else {
    local_28 = (double)(timers->utt_timer).t_elapsed / (double)(timers->utt_timer).t_cpu;
  }
  if ((double)(timers->upd_timer).t_cpu <= 0.0) {
    local_40 = 0.0;
  }
  else {
    local_40 = (double)(timers->upd_timer).t_elapsed / (double)(timers->upd_timer).t_cpu;
  }
  if ((double)(timers->fwd_timer).t_cpu <= 0.0) {
    local_58 = 0.0;
  }
  else {
    local_58 = (double)(timers->fwd_timer).t_elapsed / (double)(timers->fwd_timer).t_cpu;
  }
  if ((double)(timers->bwd_timer).t_cpu <= 0.0) {
    local_70 = 0.0;
  }
  else {
    local_70 = (double)(timers->bwd_timer).t_elapsed / (double)(timers->bwd_timer).t_cpu;
  }
  printf(" utt %4.3fx %4.3fe upd %4.3fx %4.3fe fwd %4.3fx %4.3fe bwd %4.3fx %4.3fe gau %4.3fx %4.3fe rsts %4.3fx %4.3fe rstf %4.3fx %4.3fe rstu %4.3fx %4.3fe"
         ,(double)(timers->utt_timer).t_cpu / ((double)n_frame * 0.01),local_28,
         (double)(timers->upd_timer).t_cpu / ((double)n_frame * 0.01),local_40,
         (double)(timers->fwd_timer).t_cpu / ((double)n_frame * 0.01),local_58,
         (double)(timers->bwd_timer).t_cpu / ((double)n_frame * 0.01),local_70);
  printf("\n");
  return;
}

Assistant:

static void
print_all_timers(bw_timers_t *timers, int32 n_frame)
{
    printf(" utt %4.3fx %4.3fe"
	   " upd %4.3fx %4.3fe"
	   " fwd %4.3fx %4.3fe"
	   " bwd %4.3fx %4.3fe"
	   " gau %4.3fx %4.3fe"
	   " rsts %4.3fx %4.3fe"
	   " rstf %4.3fx %4.3fe"
	   " rstu %4.3fx %4.3fe",

	timers->utt_timer.t_cpu/(n_frame*0.01),
	(timers->utt_timer.t_cpu > 0 ? timers->utt_timer.t_elapsed / timers->utt_timer.t_cpu : 0.0),

	timers->upd_timer.t_cpu/(n_frame*0.01),
	(timers->upd_timer.t_cpu > 0 ? timers->upd_timer.t_elapsed / timers->upd_timer.t_cpu : 0.0),

	timers->fwd_timer.t_cpu/(n_frame*0.01),
	(timers->fwd_timer.t_cpu > 0 ? timers->fwd_timer.t_elapsed / timers->fwd_timer.t_cpu : 0.0),

	timers->bwd_timer.t_cpu/(n_frame*0.01),
	(timers->bwd_timer.t_cpu > 0 ? timers->bwd_timer.t_elapsed / timers->bwd_timer.t_cpu : 0.0),

	timers->gau_timer.t_cpu/(n_frame*0.01),
	(timers->gau_timer.t_cpu > 0 ? timers->gau_timer.t_elapsed / timers->gau_timer.t_cpu : 0.0),

	timers->rsts_timer.t_cpu/(n_frame*0.01),
	(timers->rsts_timer.t_cpu > 0 ? timers->rsts_timer.t_elapsed / timers->rsts_timer.t_cpu : 0.0),

	timers->rstf_timer.t_cpu/(n_frame*0.01),
	(timers->rstf_timer.t_cpu > 0 ? timers->rstf_timer.t_elapsed / timers->rstf_timer.t_cpu : 0.0),

	timers->rstu_timer.t_cpu/(n_frame*0.01),
	(timers->rstu_timer.t_cpu > 0 ? timers->rstu_timer.t_elapsed / timers->rstu_timer.t_cpu : 0.0));
    printf("\n");
}